

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [32];
  ulong uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar30 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_02 [60];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [64];
  undefined1 auVar40 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [32];
  float fVar47;
  undefined1 auVar46 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  float fVar56;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  float in_register_000015dc;
  undefined1 auVar67 [32];
  undefined1 local_128 [16];
  float local_d8;
  undefined1 auVar25 [32];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  uVar11 = bottom_top_blob->c;
  uVar13 = (ulong)uVar11;
  uVar12 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar11) {
      auVar36 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                   CONCAT424(0x42b0c0a5,
                                             CONCAT420(0x42b0c0a5,
                                                       CONCAT416(0x42b0c0a5,
                                                                 CONCAT412(0x42b0c0a5,
                                                                           CONCAT48(0x42b0c0a5,
                                                                                                                                                                        
                                                  0x42b0c0a542b0c0a5)))))));
      auVar46 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                   CONCAT424(0xc2b0c0a5,
                                             CONCAT420(0xc2b0c0a5,
                                                       CONCAT416(0xc2b0c0a5,
                                                                 CONCAT412(0xc2b0c0a5,
                                                                           CONCAT48(0xc2b0c0a5,
                                                                                                                                                                        
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar50 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      uVar7 = 0;
      auVar55 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < (int)uVar12) {
          pauVar14 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar28 = auVar50;
          uVar11 = uVar12;
          do {
            auVar43 = *pauVar14;
            auVar65._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
            auVar65._8_4_ = -auVar43._8_4_;
            auVar65._12_4_ = -auVar43._12_4_;
            auVar65._16_4_ = -auVar43._16_4_;
            auVar65._20_4_ = -auVar43._20_4_;
            auVar65._24_4_ = -auVar43._24_4_;
            auVar65._28_4_ = auVar43._28_4_ ^ 0x80000000;
            auVar21 = vminps_avx(auVar65,auVar36._0_32_);
            auVar2 = vmaxps_avx(auVar21,auVar46._0_32_);
            auVar67._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
            auVar67._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
            auVar67._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
            auVar67._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
            auVar67._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
            auVar67._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
            auVar67._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
            auVar67._28_4_ = in_register_000015dc + 0.5;
            auVar22 = vroundps_avx(auVar67,1);
            auVar21 = vcmpps_avx(auVar67,auVar22,1);
            auVar21 = vandps_avx(auVar21,auVar28._0_32_);
            auVar22 = vsubps_avx(auVar22,auVar21);
            in_register_000015dc = auVar21._28_4_;
            fVar56 = auVar2._0_4_ + auVar22._0_4_ * -0.6931472;
            fVar60 = auVar2._4_4_ + auVar22._4_4_ * -0.6931472;
            fVar61 = auVar2._8_4_ + auVar22._8_4_ * -0.6931472;
            fVar62 = auVar2._12_4_ + auVar22._12_4_ * -0.6931472;
            fVar37 = auVar2._16_4_ + auVar22._16_4_ * -0.6931472;
            fVar38 = auVar2._20_4_ + auVar22._20_4_ * -0.6931472;
            fVar39 = auVar2._24_4_ + auVar22._24_4_ * -0.6931472;
            auVar59 = auVar55._0_16_;
            auVar55 = ZEXT1664(auVar59);
            auVar50 = ZEXT3264(auVar28._0_32_);
            auVar40._0_4_ = (int)auVar22._0_4_;
            auVar40._4_4_ = (int)auVar22._4_4_;
            auVar40._8_4_ = (int)auVar22._8_4_;
            auVar40._12_4_ = (int)auVar22._12_4_;
            auVar21._16_4_ = (int)auVar22._16_4_;
            auVar21._0_16_ = auVar40;
            auVar21._20_4_ = (int)auVar22._20_4_;
            auVar21._24_4_ = (int)auVar22._24_4_;
            auVar21._28_4_ = (int)auVar22._28_4_;
            auVar64 = vpslld_avx(auVar40,0x17);
            auVar40 = vpslld_avx(auVar21._16_16_,0x17);
            auVar40 = vpaddd_avx(auVar59,auVar40);
            auVar59 = vpaddd_avx(auVar64,auVar59);
            auVar22._0_4_ =
                 (fVar56 + auVar28._0_4_ +
                 fVar56 * fVar56 *
                 (fVar56 * (fVar56 * (fVar56 * (fVar56 * (fVar56 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar59._0_4_ + auVar28._0_4_;
            auVar22._4_4_ =
                 (fVar60 + auVar28._4_4_ +
                 fVar60 * fVar60 *
                 (fVar60 * (fVar60 * (fVar60 * (fVar60 * (fVar60 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar59._4_4_ + auVar28._4_4_;
            auVar22._8_4_ =
                 (fVar61 + auVar28._8_4_ +
                 fVar61 * fVar61 *
                 (fVar61 * (fVar61 * (fVar61 * (fVar61 * (fVar61 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar59._8_4_ + auVar28._8_4_;
            auVar22._12_4_ =
                 (fVar62 + auVar28._12_4_ +
                 fVar62 * fVar62 *
                 (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar59._12_4_ + auVar28._12_4_;
            auVar22._16_4_ =
                 (fVar37 + auVar28._16_4_ +
                 fVar37 * fVar37 *
                 (fVar37 * (fVar37 * (fVar37 * (fVar37 * (fVar37 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar40._0_4_ + auVar28._16_4_;
            auVar22._20_4_ =
                 (fVar38 + auVar28._20_4_ +
                 fVar38 * fVar38 *
                 (fVar38 * (fVar38 * (fVar38 * (fVar38 * (fVar38 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar40._4_4_ + auVar28._20_4_;
            auVar22._24_4_ =
                 (fVar39 + auVar28._24_4_ +
                 fVar39 * fVar39 *
                 (fVar39 * (fVar39 * (fVar39 * (fVar39 * (fVar39 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar40._8_4_ + auVar28._24_4_;
            auVar22._28_4_ = auVar40._12_4_ + auVar28._28_4_;
            auVar21 = vrcpps_avx(auVar22);
            fVar56 = auVar43._0_4_ * auVar21._0_4_;
            fVar60 = auVar43._4_4_ * auVar21._4_4_;
            fVar61 = auVar43._8_4_ * auVar21._8_4_;
            fVar62 = auVar43._12_4_ * auVar21._12_4_;
            fVar37 = auVar43._16_4_ * auVar21._16_4_;
            fVar38 = auVar43._20_4_ * auVar21._20_4_;
            fVar39 = auVar43._24_4_ * auVar21._24_4_;
            auVar2._4_4_ = fVar60 * auVar22._4_4_;
            auVar2._0_4_ = fVar56 * auVar22._0_4_;
            auVar2._8_4_ = fVar61 * auVar22._8_4_;
            auVar2._12_4_ = fVar62 * auVar22._12_4_;
            auVar2._16_4_ = fVar37 * auVar22._16_4_;
            auVar2._20_4_ = fVar38 * auVar22._20_4_;
            auVar2._24_4_ = fVar39 * auVar22._24_4_;
            auVar2._28_4_ = auVar22._28_4_;
            auVar43 = vsubps_avx(auVar43,auVar2);
            auVar36 = ZEXT3264(auVar36._0_32_);
            *(float *)*pauVar14 = fVar56 + auVar21._0_4_ * auVar43._0_4_;
            *(float *)(*pauVar14 + 4) = fVar60 + auVar21._4_4_ * auVar43._4_4_;
            *(float *)(*pauVar14 + 8) = fVar61 + auVar21._8_4_ * auVar43._8_4_;
            *(float *)(*pauVar14 + 0xc) = fVar62 + auVar21._12_4_ * auVar43._12_4_;
            *(float *)(*pauVar14 + 0x10) = fVar37 + auVar21._16_4_ * auVar43._16_4_;
            *(float *)(*pauVar14 + 0x14) = fVar38 + auVar21._20_4_ * auVar43._20_4_;
            *(float *)(*pauVar14 + 0x18) = fVar39 + auVar21._24_4_ * auVar43._24_4_;
            *(float *)(*pauVar14 + 0x1c) = auVar43._28_4_ + 0.0;
            auVar46 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                         CONCAT424(0xc2b0c0a5,
                                                   CONCAT420(0xc2b0c0a5,
                                                             CONCAT416(0xc2b0c0a5,
                                                                       CONCAT412(0xc2b0c0a5,
                                                                                 CONCAT48(0xc2b0c0a5
                                                                                          ,
                                                  0xc2b0c0a5c2b0c0a5)))))));
            pauVar14 = pauVar14 + 1;
            uVar11 = uVar11 - 1;
            auVar28 = auVar50;
          } while (uVar11 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar13);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar11) {
      uVar7 = 0;
      auVar36 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar50 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar12) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar11 = uVar12;
          do {
            auVar40 = *pauVar10;
            auVar57._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
            auVar57._8_4_ = -auVar40._8_4_;
            auVar57._12_4_ = -auVar40._12_4_;
            auVar59 = vminps_avx(auVar57,auVar36._0_16_);
            auVar52 = vmaxps_avx(auVar59,auVar46._0_16_);
            auVar63._0_4_ = auVar52._0_4_ * auVar50._0_4_ + 0.5;
            auVar63._4_4_ = auVar52._4_4_ * auVar50._4_4_ + 0.5;
            auVar63._8_4_ = auVar52._8_4_ * auVar50._8_4_ + 0.5;
            auVar63._12_4_ = auVar52._12_4_ * auVar50._12_4_ + 0.5;
            auVar66._0_4_ = (int)auVar63._0_4_;
            auVar66._4_4_ = (int)auVar63._4_4_;
            auVar66._8_4_ = (int)auVar63._8_4_;
            auVar66._12_4_ = (int)auVar63._12_4_;
            auVar64 = vcvtdq2ps_avx(auVar66);
            auVar59 = vcmpps_avx(auVar63,auVar64,1);
            auVar59 = vandps_avx(auVar59,auVar51);
            auVar59 = vsubps_avx(auVar64,auVar59);
            fVar56 = auVar52._0_4_ + auVar59._0_4_ * -0.6931472;
            fVar60 = auVar52._4_4_ + auVar59._4_4_ * -0.6931472;
            fVar61 = auVar52._8_4_ + auVar59._8_4_ * -0.6931472;
            fVar62 = auVar52._12_4_ + auVar59._12_4_ * -0.6931472;
            auVar58._0_4_ = (int)auVar59._0_4_;
            auVar58._4_4_ = (int)auVar59._4_4_;
            auVar58._8_4_ = (int)auVar59._8_4_;
            auVar58._12_4_ = (int)auVar59._12_4_;
            auVar59 = vpslld_avx(auVar58,0x17);
            auVar59 = vpaddd_avx(auVar59,auVar51);
            auVar16._0_4_ =
                 auVar59._0_4_ *
                 (fVar56 + 1.0 +
                 fVar56 * fVar56 *
                 (fVar56 * (fVar56 * (fVar56 * (fVar56 * (fVar56 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar16._4_4_ =
                 auVar59._4_4_ *
                 (fVar60 + 1.0 +
                 fVar60 * fVar60 *
                 (fVar60 * (fVar60 * (fVar60 * (fVar60 * (fVar60 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar16._8_4_ =
                 auVar59._8_4_ *
                 (fVar61 + 1.0 +
                 fVar61 * fVar61 *
                 (fVar61 * (fVar61 * (fVar61 * (fVar61 * (fVar61 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar16._12_4_ =
                 auVar59._12_4_ *
                 (fVar62 + 1.0 +
                 fVar62 * fVar62 *
                 (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar59 = vrcpps_avx(auVar16);
            fVar56 = auVar40._0_4_ * auVar59._0_4_;
            fVar60 = auVar40._4_4_ * auVar59._4_4_;
            fVar61 = auVar40._8_4_ * auVar59._8_4_;
            fVar62 = auVar40._12_4_ * auVar59._12_4_;
            auVar17._0_4_ = fVar56 * auVar16._0_4_;
            auVar17._4_4_ = fVar60 * auVar16._4_4_;
            auVar17._8_4_ = fVar61 * auVar16._8_4_;
            auVar17._12_4_ = fVar62 * auVar16._12_4_;
            auVar40 = vsubps_avx(auVar40,auVar17);
            *(float *)*pauVar10 = fVar56 + auVar59._0_4_ * auVar40._0_4_;
            *(float *)(*pauVar10 + 4) = fVar60 + auVar59._4_4_ * auVar40._4_4_;
            *(float *)(*pauVar10 + 8) = fVar61 + auVar59._8_4_ * auVar40._8_4_;
            *(float *)(*pauVar10 + 0xc) = fVar62 + auVar59._12_4_ * auVar40._12_4_;
            auVar36 = ZEXT1664(auVar36._0_16_);
            auVar46 = ZEXT1664(auVar46._0_16_);
            auVar50 = ZEXT1664(auVar50._0_16_);
            pauVar10 = pauVar10 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar13);
    }
  }
  else if (0 < (int)uVar11) {
    uVar7 = 0;
    auVar36 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    do {
      auVar49._8_4_ = 0xc2b0c0a5;
      auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._8_4_ = 0x42b0c0a5;
      auVar43._0_8_ = 0x42b0c0a542b0c0a5;
      auVar49._12_4_ = 0xc2b0c0a5;
      auVar43._12_4_ = 0x42b0c0a5;
      auVar49._16_4_ = 0xc2b0c0a5;
      auVar43._16_4_ = 0x42b0c0a5;
      auVar49._20_4_ = 0xc2b0c0a5;
      auVar43._20_4_ = 0x42b0c0a5;
      auVar49._24_4_ = 0xc2b0c0a5;
      auVar43._24_4_ = 0x42b0c0a5;
      auVar49._28_4_ = 0xc2b0c0a5;
      auVar43._28_4_ = 0x42b0c0a5;
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar12 < 8) {
        uVar11 = 0;
      }
      else {
        iVar6 = 7;
        do {
          auVar21 = *pauVar14;
          auVar34._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
          auVar34._8_4_ = -auVar21._8_4_;
          auVar34._12_4_ = -auVar21._12_4_;
          auVar34._16_4_ = -auVar21._16_4_;
          auVar34._20_4_ = -auVar21._20_4_;
          auVar34._24_4_ = -auVar21._24_4_;
          auVar34._28_4_ = auVar21._28_4_ ^ 0x80000000;
          auVar2 = vminps_avx(auVar34,auVar43);
          auVar22 = vmaxps_avx(auVar2,auVar49);
          auVar44._0_4_ = auVar22._0_4_ * 1.442695 + 0.5;
          auVar44._4_4_ = auVar22._4_4_ * 1.442695 + 0.5;
          auVar44._8_4_ = auVar22._8_4_ * 1.442695 + 0.5;
          auVar44._12_4_ = auVar22._12_4_ * 1.442695 + 0.5;
          auVar44._16_4_ = auVar22._16_4_ * 1.442695 + 0.5;
          auVar44._20_4_ = auVar22._20_4_ * 1.442695 + 0.5;
          auVar44._24_4_ = auVar22._24_4_ * 1.442695 + 0.5;
          auVar44._28_4_ = 0x42b1c0a5;
          auVar65 = vroundps_avx(auVar44,1);
          auVar2 = vcmpps_avx(auVar44,auVar65,1);
          auVar2 = vandps_avx(auVar36._0_32_,auVar2);
          auVar2 = vsubps_avx(auVar65,auVar2);
          fVar56 = auVar22._0_4_ + auVar2._0_4_ * -0.6931472;
          fVar60 = auVar22._4_4_ + auVar2._4_4_ * -0.6931472;
          fVar61 = auVar22._8_4_ + auVar2._8_4_ * -0.6931472;
          fVar62 = auVar22._12_4_ + auVar2._12_4_ * -0.6931472;
          fVar37 = auVar22._16_4_ + auVar2._16_4_ * -0.6931472;
          fVar38 = auVar22._20_4_ + auVar2._20_4_ * -0.6931472;
          fVar39 = auVar22._24_4_ + auVar2._24_4_ * -0.6931472;
          auVar59._0_4_ = (int)auVar2._0_4_;
          auVar59._4_4_ = (int)auVar2._4_4_;
          auVar59._8_4_ = (int)auVar2._8_4_;
          auVar59._12_4_ = (int)auVar2._12_4_;
          auVar45._16_4_ = (int)auVar2._16_4_;
          auVar45._0_16_ = auVar59;
          auVar45._20_4_ = (int)auVar2._20_4_;
          auVar45._24_4_ = (int)auVar2._24_4_;
          auVar45._28_4_ = (int)auVar2._28_4_;
          auVar59 = vpslld_avx(auVar59,0x17);
          auVar40 = vpslld_avx(auVar45._16_16_,0x17);
          auVar64._8_4_ = 0x3f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar64._12_4_ = 0x3f800000;
          auVar40 = vpaddd_avx(auVar40,auVar64);
          auVar59 = vpaddd_avx(auVar59,auVar64);
          auVar35._0_4_ =
               auVar36._0_4_ +
               (auVar36._0_4_ + fVar56 +
               fVar56 * fVar56 *
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar59._0_4_;
          auVar35._4_4_ =
               auVar36._4_4_ +
               (auVar36._4_4_ + fVar60 +
               fVar60 * fVar60 *
               (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                 0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5)) * auVar59._4_4_;
          auVar35._8_4_ =
               auVar36._8_4_ +
               (auVar36._8_4_ + fVar61 +
               fVar61 * fVar61 *
               (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5)) * auVar59._8_4_;
          auVar35._12_4_ =
               auVar36._12_4_ +
               (auVar36._12_4_ + fVar62 +
               fVar62 * fVar62 *
               (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5)) * auVar59._12_4_;
          auVar35._16_4_ =
               auVar36._16_4_ +
               (auVar36._16_4_ + fVar37 +
               fVar37 * fVar37 *
               (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar40._0_4_;
          auVar35._20_4_ =
               auVar36._20_4_ +
               (auVar36._20_4_ + fVar38 +
               fVar38 * fVar38 *
               (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar40._4_4_;
          auVar35._24_4_ =
               auVar36._24_4_ +
               (auVar36._24_4_ + fVar39 +
               fVar39 * fVar39 *
               (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar40._8_4_;
          auVar35._28_4_ =
               auVar36._28_4_ + auVar36._28_4_ + auVar22._28_4_ + -0.6931472 + -0.6931472;
          auVar2 = vrcpps_avx(auVar35);
          fVar56 = auVar21._0_4_ * auVar2._0_4_;
          fVar60 = auVar21._4_4_ * auVar2._4_4_;
          fVar61 = auVar21._8_4_ * auVar2._8_4_;
          fVar62 = auVar21._12_4_ * auVar2._12_4_;
          fVar37 = auVar21._16_4_ * auVar2._16_4_;
          fVar38 = auVar21._20_4_ * auVar2._20_4_;
          fVar39 = auVar21._24_4_ * auVar2._24_4_;
          auVar3._4_4_ = auVar35._4_4_ * fVar60;
          auVar3._0_4_ = auVar35._0_4_ * fVar56;
          auVar3._8_4_ = auVar35._8_4_ * fVar61;
          auVar3._12_4_ = auVar35._12_4_ * fVar62;
          auVar3._16_4_ = auVar35._16_4_ * fVar37;
          auVar3._20_4_ = auVar35._20_4_ * fVar38;
          auVar3._24_4_ = auVar35._24_4_ * fVar39;
          auVar3._28_4_ = auVar35._28_4_;
          auVar21 = vsubps_avx(auVar21,auVar3);
          *(float *)*pauVar14 = fVar56 + auVar2._0_4_ * auVar21._0_4_;
          *(float *)(*pauVar14 + 4) = fVar60 + auVar2._4_4_ * auVar21._4_4_;
          *(float *)(*pauVar14 + 8) = fVar61 + auVar2._8_4_ * auVar21._8_4_;
          *(float *)(*pauVar14 + 0xc) = fVar62 + auVar2._12_4_ * auVar21._12_4_;
          *(float *)(*pauVar14 + 0x10) = fVar37 + auVar2._16_4_ * auVar21._16_4_;
          *(float *)(*pauVar14 + 0x14) = fVar38 + auVar2._20_4_ * auVar21._20_4_;
          *(float *)(*pauVar14 + 0x18) = fVar39 + auVar2._24_4_ * auVar21._24_4_;
          *(float *)(*pauVar14 + 0x1c) = auVar21._28_4_ + 0.0;
          pauVar14 = pauVar14 + 1;
          iVar6 = iVar6 + 8;
          uVar11 = uVar12 & 0xfffffff8;
        } while (iVar6 < (int)uVar12);
      }
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar53._8_4_ = 0x42b0c0a5;
      auVar53._0_8_ = 0x42b0c0a542b0c0a5;
      auVar53._12_4_ = 0x42b0c0a5;
      auVar54._8_4_ = 0xc2b0c0a5;
      auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar54._12_4_ = 0xc2b0c0a5;
      uVar9 = uVar11 | 3;
      while ((int)uVar9 < (int)uVar12) {
        auVar40 = *(undefined1 (*) [16])*pauVar14;
        auVar30._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
        auVar30._8_4_ = -auVar40._8_4_;
        auVar30._12_4_ = -auVar40._12_4_;
        auVar59 = vminps_avx(auVar53,auVar30);
        auVar30 = vmaxps_avx(auVar54,auVar59);
        auVar41._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
        auVar41._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
        auVar41._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
        auVar41._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
        auVar48._0_4_ = (int)auVar41._0_4_;
        auVar48._4_4_ = (int)auVar41._4_4_;
        auVar48._8_4_ = (int)auVar41._8_4_;
        auVar48._12_4_ = (int)auVar41._12_4_;
        auVar64 = vcvtdq2ps_avx(auVar48);
        auVar59 = vcmpps_avx(auVar41,auVar64,1);
        auVar59 = vandps_avx(auVar59,auVar52);
        auVar59 = vsubps_avx(auVar64,auVar59);
        fVar56 = auVar30._0_4_ + auVar59._0_4_ * -0.6931472;
        fVar60 = auVar30._4_4_ + auVar59._4_4_ * -0.6931472;
        fVar61 = auVar30._8_4_ + auVar59._8_4_ * -0.6931472;
        fVar62 = auVar30._12_4_ + auVar59._12_4_ * -0.6931472;
        auVar42._0_4_ = (int)auVar59._0_4_;
        auVar42._4_4_ = (int)auVar59._4_4_;
        auVar42._8_4_ = (int)auVar59._8_4_;
        auVar42._12_4_ = (int)auVar59._12_4_;
        auVar59 = vpslld_avx(auVar42,0x17);
        auVar59 = vpaddd_avx(auVar59,auVar52);
        auVar31._0_4_ =
             (fVar56 + 1.0 +
             fVar56 * fVar56 *
             (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
               0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar59._0_4_ + 1.0;
        auVar31._4_4_ =
             (fVar60 + 1.0 +
             fVar60 * fVar60 *
             (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
               0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5)) * auVar59._4_4_ + 1.0;
        auVar31._8_4_ =
             (fVar61 + 1.0 +
             fVar61 * fVar61 *
             (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
               0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5)) * auVar59._8_4_ + 1.0;
        auVar31._12_4_ =
             (fVar62 + 1.0 +
             fVar62 * fVar62 *
             (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
               0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5)) * auVar59._12_4_ + 1.0;
        auVar59 = vrcpps_avx(auVar31);
        fVar56 = auVar40._0_4_ * auVar59._0_4_;
        fVar60 = auVar40._4_4_ * auVar59._4_4_;
        fVar61 = auVar40._8_4_ * auVar59._8_4_;
        fVar62 = auVar40._12_4_ * auVar59._12_4_;
        auVar32._0_4_ = auVar31._0_4_ * fVar56;
        auVar32._4_4_ = auVar31._4_4_ * fVar60;
        auVar32._8_4_ = auVar31._8_4_ * fVar61;
        auVar32._12_4_ = auVar31._12_4_ * fVar62;
        auVar40 = vsubps_avx(auVar40,auVar32);
        *(float *)*pauVar14 = fVar56 + auVar59._0_4_ * auVar40._0_4_;
        *(float *)(*pauVar14 + 4) = fVar60 + auVar59._4_4_ * auVar40._4_4_;
        *(float *)(*pauVar14 + 8) = fVar61 + auVar59._8_4_ * auVar40._8_4_;
        *(float *)(*pauVar14 + 0xc) = fVar62 + auVar59._12_4_ * auVar40._12_4_;
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        uVar9 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar40 = vpcmpeqd_avx(auVar52,auVar52);
      if ((int)uVar11 < (int)uVar12) {
        uVar8 = CONCAT44(0,~uVar11 + uVar12);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar8;
        auVar52 = vpshufd_avx(auVar18,0x44);
        auVar59 = vpor_avx(auVar52,auVar5);
        auVar64 = vpor_avx(auVar52,auVar5);
        uVar15 = 0;
        auVar43 = _DAT_00318240;
        do {
          auVar1._8_8_ = 0x8000000000000000;
          auVar1._0_8_ = 0x8000000000000000;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar15;
          auVar53 = vpshufd_avx(auVar19,0x44);
          auVar23._16_16_ = auVar53;
          auVar23._0_16_ = auVar53;
          auVar21 = vorps_avx(auVar23,_DAT_00318220);
          auVar43 = vorps_avx(auVar23,auVar43);
          auVar30 = vpor_avx(auVar52,auVar1);
          auVar53 = vpcmpgtq_avx(auVar43._16_16_ ^ auVar1,auVar30);
          auVar54 = vpcmpgtq_avx(auVar43._0_16_ ^ auVar1,auVar59);
          auVar53 = vpackssdw_avx(auVar54,auVar53);
          auVar54 = vpcmpgtq_avx(auVar21._16_16_ ^ auVar1,auVar30);
          auVar33._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
          auVar33._8_4_ = auVar21._8_4_;
          auVar33._12_4_ = auVar21._12_4_ ^ 0x80000000;
          auVar30 = vpcmpgtq_avx(auVar33,auVar64);
          auVar54 = vpackssdw_avx(auVar30,auVar54);
          auVar53 = vpackssdw_avx(auVar54 ^ auVar40,auVar53 ^ auVar40);
          auVar54 = vpmovsxwd_avx(auVar53);
          auVar53 = vpunpckhwd_avx(auVar53,auVar53);
          auVar24._16_16_ = auVar53;
          auVar24._0_16_ = auVar54;
          auVar2 = vmaskmovps_avx(auVar24,*(undefined1 (*) [32])(*pauVar14 + uVar15 * 4));
          auVar20._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
          auVar20._8_4_ = -auVar2._8_4_;
          auVar20._12_4_ = -auVar2._12_4_;
          auVar25._16_4_ = -auVar2._16_4_;
          auVar25._0_16_ = auVar20;
          auVar25._20_4_ = -auVar2._20_4_;
          auVar25._24_4_ = -auVar2._24_4_;
          auVar25._28_4_ = auVar2._28_4_ ^ 0x80000000;
          auVar30 = auVar25._16_16_;
          local_128._0_4_ = expf(auVar25._16_4_);
          local_128._4_4_ = extraout_XMM0_Db;
          local_128._8_4_ = extraout_XMM0_Dc;
          local_128._12_4_ = extraout_XMM0_Dd;
          auVar53 = vpermilps_avx(auVar30,0xf5);
          auVar36._0_4_ = expf(auVar53._0_4_);
          auVar36._4_60_ = extraout_var;
          auVar53 = vinsertps_avx(local_128,auVar36._0_16_,0x10);
          auVar54 = vpermilps_avx(auVar30,0x4e);
          auVar46._0_4_ = expf(auVar54._0_4_);
          auVar46._4_60_ = extraout_var_00;
          auVar53 = vinsertps_avx(auVar53,auVar46._0_16_,0x20);
          auVar54 = vpermilps_avx(auVar30,0xff);
          auVar50._0_4_ = expf(auVar54._0_4_);
          auVar50._4_60_ = extraout_var_01;
          auVar53 = vinsertps_avx(auVar53,auVar50._0_16_,0x30);
          local_d8 = (float)auVar20._0_8_;
          fVar47 = 0.0;
          local_128._0_4_ = expf(local_d8);
          local_128._4_4_ = extraout_XMM0_Db_00;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          auVar54 = vpermilps_avx(auVar20,0xf5);
          auVar55._0_4_ = expf(auVar54._0_4_);
          auVar55._4_60_ = extraout_var_02;
          auVar54 = vinsertps_avx(local_128,auVar55._0_16_,0x10);
          auVar30 = vpermilps_avx(auVar20,0x4e);
          auVar28._0_4_ = expf(auVar30._0_4_);
          auVar28._4_60_ = extraout_var_03;
          auVar54 = vinsertps_avx(auVar54,auVar28._0_16_,0x20);
          auVar30 = vpermilps_avx(auVar20,0xff);
          auVar29._0_4_ = expf(auVar30._0_4_);
          auVar43 = _DAT_00318240;
          auVar29._4_60_ = extraout_var_04;
          auVar40 = vpcmpeqd_avx(auVar40,auVar40);
          auVar36 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar54 = vinsertps_avx(auVar54,auVar29._0_16_,0x30);
          auVar26._0_4_ = auVar54._0_4_ + 1.0;
          auVar26._4_4_ = auVar54._4_4_ + 1.0;
          auVar26._8_4_ = auVar54._8_4_ + 1.0;
          auVar26._12_4_ = auVar54._12_4_ + 1.0;
          auVar26._16_4_ = auVar53._0_4_ + 1.0;
          auVar26._20_4_ = auVar53._4_4_ + 1.0;
          auVar26._24_4_ = auVar53._8_4_ + 1.0;
          auVar26._28_4_ = auVar53._12_4_ + 1.0;
          auVar21 = vrcpps_avx(auVar26);
          fVar56 = auVar2._0_4_ * auVar21._0_4_;
          fVar60 = auVar2._4_4_ * auVar21._4_4_;
          fVar61 = auVar2._8_4_ * auVar21._8_4_;
          fVar62 = auVar2._12_4_ * auVar21._12_4_;
          fVar37 = auVar2._16_4_ * auVar21._16_4_;
          fVar38 = auVar2._20_4_ * auVar21._20_4_;
          fVar39 = auVar2._24_4_ * auVar21._24_4_;
          auVar4._4_4_ = auVar26._4_4_ * fVar60;
          auVar4._0_4_ = auVar26._0_4_ * fVar56;
          auVar4._8_4_ = auVar26._8_4_ * fVar61;
          auVar4._12_4_ = auVar26._12_4_ * fVar62;
          auVar4._16_4_ = auVar26._16_4_ * fVar37;
          auVar4._20_4_ = auVar26._20_4_ * fVar38;
          auVar4._24_4_ = auVar26._24_4_ * fVar39;
          auVar4._28_4_ = auVar26._28_4_;
          auVar2 = vsubps_avx(auVar2,auVar4);
          auVar27._0_4_ = fVar56 + auVar21._0_4_ * auVar2._0_4_;
          auVar27._4_4_ = fVar60 + auVar21._4_4_ * auVar2._4_4_;
          auVar27._8_4_ = fVar61 + auVar21._8_4_ * auVar2._8_4_;
          auVar27._12_4_ = fVar62 + auVar21._12_4_ * auVar2._12_4_;
          auVar27._16_4_ = fVar37 + auVar21._16_4_ * auVar2._16_4_;
          auVar27._20_4_ = fVar38 + auVar21._20_4_ * auVar2._20_4_;
          auVar27._24_4_ = fVar39 + auVar21._24_4_ * auVar2._24_4_;
          auVar27._28_4_ = fVar47 + auVar2._28_4_;
          auVar21 = vmaskmovps_avx(auVar24,auVar27);
          *(undefined1 (*) [32])(*pauVar14 + uVar15 * 4) = auVar21;
          uVar15 = uVar15 + 8;
        } while ((uVar8 + 8 & 0xfffffffffffffff8) != uVar15);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar13);
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}